

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDate __thiscall QDate::addYears(QDate *this,int nyears)

{
  int iVar1;
  _Storage<long_long,_true> _Var2;
  int iVar3;
  int iVar4;
  optional<long_long> oVar5;
  YearMonthDay YVar6;
  
  if (0xfffffe92c1eb868b < this->jd - 0xb69f248055U) {
    YVar6 = QGregorianCalendar::partsFromJulian(this->jd);
    if ((YVar6._0_8_ & 0xffffffff00000000) != 0x8000000000000000) {
      iVar1 = YVar6.year + nyears;
      iVar3 = (uint)(0 < nyears) * 2 + -1;
      iVar4 = 0;
      if (iVar1 < 1 == 0 < YVar6.year) {
        iVar4 = iVar3;
      }
      if (iVar1 == 0) {
        iVar4 = iVar3;
      }
      iVar4 = iVar4 + iVar1;
      if (iVar4 != 0) {
        iVar3 = QGregorianCalendar::monthLength(YVar6.month,iVar4);
        iVar1 = YVar6.day;
        if (iVar3 < YVar6.day) {
          iVar1 = iVar3;
        }
        oVar5 = QGregorianCalendar::julianFromParts(iVar4,YVar6.month,iVar1);
        _Var2._M_value =
             oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
        if (_Var2._M_value - 0xb69f248055U < 0xfffffe92c1eb868c) {
          _Var2._M_value = -0x8000000000000000;
        }
        if (((undefined1  [16])
             oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          return (QDate)_Var2._M_value;
        }
      }
    }
  }
  return (QDate)-0x8000000000000000;
}

Assistant:

QDate QDate::addYears(int nyears) const
{
    if (isNull())
        return QDate();

    auto parts = QGregorianCalendar::partsFromJulian(jd);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if ((old_y > 0) != (parts.year > 0) || !parts.year)
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts);
}